

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QList<QTimeZonePrivate::Data> * __thiscall
QTzTimeZonePrivate::getPosixTransitions
          (QList<QTimeZonePrivate::Data> *__return_storage_ptr__,QTzTimeZonePrivate *this,
          qint64 msNear)

{
  long lVar1;
  char *begin_00;
  qsizetype i;
  weak_ordering wVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  qint64 qVar7;
  int iVar8;
  QTzTransitionTime *in_RCX;
  Data *pDVar9;
  bool bVar10;
  int y;
  int iVar11;
  Data *pDVar12;
  Data data;
  int iVar13;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDateTime std;
  QDateTime dst;
  char *begin;
  Data standard;
  Data saving;
  long local_1d8;
  Data local_198;
  QTimeZone local_190;
  QDateTime local_188;
  Data local_180;
  Data local_178;
  Data local_170;
  Data local_168;
  Data local_160;
  QByteArray local_158;
  QArrayDataPointer<QByteArray> local_138;
  QByteArray local_118;
  PosixZone local_f8;
  QArrayDataPointer<QByteArray> local_d8;
  long local_c0;
  Data local_b8;
  Data *pDStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  Data local_88;
  Data *pDStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  Data local_58;
  Data *pDStack_50;
  long local_48;
  int local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (Data)0x2;
  QDateTime::fromMSecsSinceEpoch((QDateTime *)&local_b8.data,msNear,(QTimeZone *)&local_58.data);
  local_88.data = (ShortData)QDateTime::date((QDateTime *)&local_b8.data);
  iVar5 = QDate::year((QDate *)&local_88.data);
  QDateTime::~QDateTime((QDateTime *)&local_b8.data);
  QTimeZone::~QTimeZone((QTimeZone *)&local_58.data);
  lVar1 = (this->cached_data).m_tranTimes.d.size;
  if (lVar1 != 0) {
    in_RCX = (this->cached_data).m_tranTimes.d.ptr;
    msNear = in_RCX[lVar1 + -1].atMSecsSinceEpoch;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Data *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_c0 = msNear;
  QByteArray::split((QList<QByteArray> *)&local_d8,&(this->cached_data).m_posixRule,',');
  local_40[0] = -0x80000000;
  local_40[1] = -0x55555556;
  local_58.d = (QDateTimePrivate *)0x0;
  pDStack_50 = (Data *)0x0;
  local_48 = 0;
  QByteArray::trimmed_helper((QByteArray *)&local_b8.data,local_d8.ptr);
  local_f8.name.d.d = pDStack_b0;
  anon_unknown.dwarf_13b371b::PosixZone::parse
            ((PosixZone *)&local_88.data,&local_f8,
             (char **)((long)&(pDStack_b0->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                              _M_i + (long)local_a8),(char *)in_RCX);
  local_58.d = local_88.d;
  pDStack_50 = pDStack_80;
  local_48 = (long)local_78;
  local_40[0] = (int)puStack_70;
  pDVar12 = (Data *)((long)&(pDStack_b0->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                            _M_i + (long)local_a8);
  if (local_f8.name.d.d < pDVar12) {
    anon_unknown.dwarf_13b371b::PosixZone::parse
              ((PosixZone *)&local_88.data,&local_f8,(char **)pDVar12,(char *)in_RCX);
    local_1d8 = (long)local_78;
    in_RCX = (QTzTransitionTime *)(ulong)(uint)-(int)puStack_70;
    pDVar12 = pDStack_80;
    data = local_88;
    iVar13 = (int)puStack_70;
  }
  else {
    local_1d8 = 0;
    pDVar12 = (Data *)0x0;
    data.d = (QDateTimePrivate *)0x0;
    iVar13 = -0x80000000;
  }
  if (local_b8.d != (QDateTimePrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_b8.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_b8.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_b8.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8.d,1,0x10);
    }
  }
  if ((undefined1 *)local_d8.size == (undefined1 *)0x1) {
    if (local_48 == 0) {
      ba.m_data = (storage_type *)in_RCX;
      ba.m_size = (qsizetype)((local_d8.ptr)->d).ptr;
      QString::fromUtf8((QString *)&local_88.data,(QString *)((local_d8.ptr)->d).size,ba);
    }
    else {
      local_88.d = local_58.d;
      pDStack_80 = pDStack_50;
      local_78 = (undefined1 *)local_48;
      if (local_58.d != (QDateTimePrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QString,long_long&,int&,int&>
              ((QMovableArrayOps<QTimeZonePrivate::Data> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,(QString *)&local_88.data,&local_c0,local_40,
               local_40);
    QList<QTimeZonePrivate::Data>::end(__return_storage_ptr__);
    if (local_88.d != (QDateTimePrivate *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_88.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_88.d)->super_QSharedData)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_88.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88.d,2,0x10);
      }
    }
  }
  else if ((((undefined1 *)0x2 < (ulong)local_d8.size) && (local_d8.ptr[1].d.size != 0)) &&
          (local_d8.ptr[2].d.size != 0)) {
    local_f8.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((QList<QByteArray> *)&local_f8,local_d8.ptr + 1,'/');
    local_118.d.d = *(Data **)local_f8.name.d.ptr;
    local_118.d.ptr = *(char **)(local_f8.name.d.ptr + 4);
    local_118.d.size = *(qsizetype *)(local_f8.name.d.ptr + 8);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((undefined1 *)0x1 < (ulong)local_f8.name.d.size) {
      parsePosixTime(*(char **)(local_f8.name.d.ptr + 0x10),
                     *(char **)(local_f8.name.d.ptr + 0x10) + *(long *)(local_f8.name.d.ptr + 0x14))
      ;
    }
    local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_138.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((QList<QByteArray> *)&local_138,local_d8.ptr + 2,'/');
    local_158.d.d = ((local_138.ptr)->d).d;
    local_158.d.ptr = ((local_138.ptr)->d).ptr;
    local_158.d.size = ((local_138.ptr)->d).size;
    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((undefined1 *)0x1 < (ulong)local_138.size) {
      begin_00 = local_138.ptr[1].d.ptr;
      parsePosixTime(begin_00,begin_00 + local_138.ptr[1].d.size);
    }
    if ((local_118.d.size != 0) && (local_158.d.size != 0)) {
      iVar8 = 0x116bd2d3;
      if (iVar5 < 0x116bd2d3) {
        iVar8 = iVar5;
      }
      iVar8 = iVar8 + -1;
      y = -0x116bc370;
      if (-0x116bc370 < iVar8) {
        y = iVar8;
      }
      iVar11 = 0x116bd2d1;
      if (iVar5 < 0x116bd2d1) {
        iVar11 = iVar5;
      }
      iVar5 = -0x116bc371;
      if (-0x116bc371 < iVar11) {
        iVar5 = iVar11;
      }
      if (iVar8 <= iVar5 + 1) {
        iVar8 = 0;
        bVar10 = false;
        do {
          pDVar9 = &local_b8;
          iVar11 = y + iVar8;
          local_160.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.data = (ShortData)calculatePosixDate(&local_118,iVar11);
          local_168 = (Data)0x2;
          QDate::startOfDay((QDate *)&local_88.data,(QTimeZone *)&pDVar9->data);
          QDateTime::addSecs((QDateTime *)&local_160.data,(qint64)&local_88);
          QDateTime::~QDateTime((QDateTime *)&local_88.data);
          QTimeZone::~QTimeZone((QTimeZone *)&local_168.s);
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_88.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          pDStack_80 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          qVar7 = QDateTime::toMSecsSinceEpoch((QDateTime *)&local_160.data);
          local_78 = (undefined1 *)local_1d8;
          if (data.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
            _M_i = (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          puStack_70 = (undefined1 *)(qVar7 + (long)local_40[0] * -1000);
          local_68 = (undefined1 *)CONCAT44(local_40[0],iVar13);
          puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,iVar13 - local_40[0]);
          local_168.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_88 = data;
          pDStack_80 = pDVar12;
          local_170.s = (ShortData)calculatePosixDate(&local_158,iVar11);
          local_178 = (Data)0x2;
          QDate::startOfDay((QDate *)&pDVar9->data,(QTimeZone *)&local_170.s);
          QDateTime::addSecs((QDateTime *)&local_168.s,(qint64)pDVar9);
          QDateTime::~QDateTime((QDateTime *)&pDVar9->data);
          QTimeZone::~QTimeZone((QTimeZone *)&local_178.s);
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          pDStack_b0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          qVar7 = QDateTime::toMSecsSinceEpoch((QDateTime *)&local_168.s);
          local_b8.d = local_58.d;
          pDStack_b0 = pDStack_50;
          local_a8 = (undefined1 *)local_48;
          if (local_58.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          puStack_a0 = (undefined1 *)(qVar7 - iVar13 * 1000);
          local_98 = (undefined1 *)CONCAT44(local_40[0],local_40[0]);
          puStack_90 = (undefined1 *)((ulong)puStack_90 & 0xffffffff00000000);
          if (iVar8 == 0) {
            if ((long)puStack_a0 <= (long)puStack_70) {
              QDate::QDate((QDate *)&local_178.s,y,1,1);
              local_180 = (Data)0x2;
              QDate::startOfDay((QDate *)&local_170.s,(QTimeZone *)&local_178.s);
              wVar2 = compareThreeWay((QDateTime *)&local_168.s,(QDateTime *)&local_170.s);
              if ('\0' < wVar2.m_order) goto LAB_003fe231;
              QDate::QDate((QDate *)&local_190,y,0xc,0x1f);
              local_198 = (Data)0x2;
              QDate::endOfDay((QDate *)&local_188,&local_190);
              wVar2 = compareThreeWay((QDateTime *)&local_160.data,&local_188);
              QDateTime::~QDateTime(&local_188);
              QTimeZone::~QTimeZone((QTimeZone *)&local_198.s);
              QDateTime::~QDateTime((QDateTime *)&local_170.s);
              QTimeZone::~QTimeZone((QTimeZone *)&local_180.s);
              if (-1 < wVar2.m_order) {
                puStack_a0 = (undefined1 *)local_c0;
                goto LAB_003fe4b4;
              }
              goto LAB_003fe248;
            }
            QDate::QDate((QDate *)&local_178.s,y,1,1);
            local_180 = (Data)0x2;
            QDate::startOfDay((QDate *)&local_170.s,(QTimeZone *)&local_178.s);
            wVar2 = compareThreeWay((QDateTime *)&local_160.data,(QDateTime *)&local_170.s);
            if ('\0' < wVar2.m_order) {
LAB_003fe231:
              QDateTime::~QDateTime((QDateTime *)&local_170.s);
              QTimeZone::~QTimeZone((QTimeZone *)&local_180.s);
              goto LAB_003fe248;
            }
            QDate::QDate((QDate *)&local_190,y,0xc,0x1f);
            local_198 = (Data)0x2;
            QDate::endOfDay((QDate *)&local_188,&local_190);
            wVar2 = compareThreeWay((QDateTime *)&local_168.s,&local_188);
            QDateTime::~QDateTime(&local_188);
            QTimeZone::~QTimeZone((QTimeZone *)&local_198.s);
            QDateTime::~QDateTime((QDateTime *)&local_170.s);
            QTimeZone::~QTimeZone((QTimeZone *)&local_180.s);
            if (wVar2.m_order < '\0') goto LAB_003fe248;
            puStack_70 = (undefined1 *)local_c0;
            pDVar9 = &local_88;
LAB_003fe4b4:
            QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QTimeZonePrivate::Data>
                      ((QMovableArrayOps<QTimeZonePrivate::Data> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,(Data *)&pDVar9->data);
            QList<QTimeZonePrivate::Data>::end(__return_storage_ptr__);
            bVar10 = true;
            bVar4 = false;
          }
          else {
LAB_003fe248:
            bVar3 = QDateTime::isValid((QDateTime *)&local_168.s);
            if (bVar3) {
              local_170.s = (ShortData)QDateTime::date((QDateTime *)&local_168.s);
              iVar6 = QDate::year((QDate *)&local_170.s);
              if (iVar11 != iVar6) goto LAB_003fe28f;
              bVar3 = local_48 != 0;
            }
            else {
LAB_003fe28f:
              bVar3 = false;
            }
            bVar4 = QDateTime::isValid((QDateTime *)&local_160.data);
            if (bVar4) {
              local_170.s = (ShortData)QDateTime::date((QDateTime *)&local_160.data);
              iVar6 = QDate::year((QDate *)&local_170.s);
              if (iVar11 != iVar6) goto LAB_003fe328;
              if (bVar3 && local_1d8 != 0) {
                wVar2 = compareThreeWay((QDateTime *)&local_160.data,(QDateTime *)&local_168.s);
                i = (__return_storage_ptr__->d).size;
                if (wVar2.m_order < '\0') {
                  QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::
                  emplace<QTimeZonePrivate::Data>
                            ((QMovableArrayOps<QTimeZonePrivate::Data> *)__return_storage_ptr__,i,
                             (Data *)&local_88.data);
                  QList<QTimeZonePrivate::Data>::end(__return_storage_ptr__);
                  pDVar9 = &local_b8;
                }
                else {
                  QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::
                  emplace<QTimeZonePrivate::Data>
                            ((QMovableArrayOps<QTimeZonePrivate::Data> *)__return_storage_ptr__,i,
                             (Data *)&local_b8.data);
                  QList<QTimeZonePrivate::Data>::end(__return_storage_ptr__);
                  pDVar9 = &local_88;
                }
              }
              else {
                pDVar9 = &local_b8;
                if (!bVar3) {
                  bVar4 = true;
                  if (local_1d8 != 0) {
                    QList<QTimeZonePrivate::Data>::emplaceBack<QTimeZonePrivate::Data>
                              (__return_storage_ptr__,(Data *)&local_88.data);
                  }
                  goto LAB_003fe34f;
                }
              }
            }
            else {
LAB_003fe328:
              bVar4 = true;
              pDVar9 = &local_b8;
              if (!bVar3) goto LAB_003fe34f;
            }
            QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QTimeZonePrivate::Data>
                      ((QMovableArrayOps<QTimeZonePrivate::Data> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,(Data *)&pDVar9->data);
            bVar4 = true;
            QList<QTimeZonePrivate::Data>::end(__return_storage_ptr__);
          }
LAB_003fe34f:
          if (local_b8.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_b8.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_b8.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_b8.d)->super_QSharedData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_b8.d,2,0x10);
            }
          }
          QDateTime::~QDateTime((QDateTime *)&local_168.s);
          if (local_88.d != (QDateTimePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_88.d)->super_QSharedData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_88.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_88.d)->super_QSharedData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_88.d,2,0x10);
            }
          }
          QDateTime::~QDateTime((QDateTime *)&local_160.data);
          if (!bVar4) goto LAB_003fdc79;
          iVar8 = iVar8 + 1;
        } while ((iVar5 - y) + 2 != iVar8);
      }
    }
    bVar10 = true;
LAB_003fdc79:
    if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,1,0x10);
      }
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_138);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
      }
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_f8);
    if (data.d != (QDateTimePrivate *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate((QArrayData *)data.d,2,0x10);
      }
    }
    if (local_58.d != (QDateTimePrivate *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.d,2,0x10);
      }
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_d8);
    if (!bVar10) {
      QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&__return_storage_ptr__->d);
    }
    goto LAB_003fde56;
  }
  if (data.d != (QDateTimePrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(data.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate((QArrayData *)data.d,2,0x10);
    }
  }
  if (local_58.d != (QDateTimePrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58.d,2,0x10);
    }
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_d8);
LAB_003fde56:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTimeZonePrivate::Data> QTzTimeZonePrivate::getPosixTransitions(qint64 msNear) const
{
    const int year = QDateTime::fromMSecsSinceEpoch(msNear, QTimeZone::UTC).date().year();
    // The Data::atMSecsSinceEpoch of the single entry if zone is constant:
    qint64 atTime = tranCache().isEmpty() ? msNear : tranCache().last().atMSecsSinceEpoch;
    return calculatePosixTransitions(cached_data.m_posixRule, year - 1, year + 1, atTime);
}